

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall duckdb::WKBColumnWriter::InitializeWriteState(WKBColumnWriter *this,RowGroup *row_group)

{
  _Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false> _Var1;
  pointer pWVar2;
  RowGroup *in_RDX;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::WKBColumnWriterState_*,_false> local_30;
  unsigned_long local_28;
  
  local_28 = ((long)(in_RDX->columns).
                    super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                    .
                    super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(in_RDX->columns).
                   super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                   .
                   super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x280;
  make_uniq<duckdb::WKBColumnWriterState,duckdb::ParquetWriter&,duckdb_parquet::RowGroup&,unsigned_long>
            ((duckdb *)&local_30,
             (ParquetWriter *)
             (row_group->columns).
             super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             .
             super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ._M_impl.super__Vector_impl_data._M_start,in_RDX,&local_28);
  pWVar2 = unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>,_true>
           ::operator->((unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>,_true>
                         *)&local_30);
  (pWVar2->
  super_StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>).
  encoding = RLE_DICTIONARY;
  PrimitiveColumnWriter::RegisterToRowGroup((PrimitiveColumnWriter *)row_group,in_RDX);
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (WKBColumnWriterState *)0x0;
  (this->
  super_StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>).
  super_PrimitiveColumnWriter.super_ColumnWriter._vptr_ColumnWriter =
       (_func_int **)_Var1._M_head_impl;
  ::std::
  unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>_>::
  ~unique_ptr((unique_ptr<duckdb::WKBColumnWriterState,_std::default_delete<duckdb::WKBColumnWriterState>_>
               *)&local_30);
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> InitializeWriteState(duckdb_parquet::RowGroup &row_group) override {
		auto result = make_uniq<WKBColumnWriterState>(writer, row_group, row_group.columns.size());
		result->encoding = Encoding::RLE_DICTIONARY;
		RegisterToRowGroup(row_group);
		return std::move(result);
	}